

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_Optional_Test::Body(iu_Matcher_x_iutest_x_Optional_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  optional<int> *v;
  optional<int> *v_00;
  optional<int> *v_01;
  optional<std::unique_ptr<int,_std::default_delete<int>_>_> *v_02;
  AssertionResult *in_R8;
  EqMatcher<int> EVar3;
  LtMatcher<int> LVar4;
  string local_9a0;
  string local_980;
  AssertionHelper local_960;
  Fixed local_930;
  IsNullMatcher local_7a8;
  OptionalMatcher<iutest::detail::IsNullMatcher> local_7a0;
  undefined1 local_770 [8];
  AssertionResult iutest_ar_3;
  string local_728;
  AssertionHelper local_708;
  Fixed local_6d8;
  int local_54c;
  LtMatcher<int> local_548;
  OptionalMatcher<iutest::detail::LtMatcher<int>_> local_538;
  undefined1 local_508 [8];
  AssertionResult iutest_ar_2;
  string local_4c0;
  AssertionHelper local_4a0;
  Fixed local_470;
  int local_2e4;
  EqMatcher<int> local_2e0;
  OptionalMatcher<iutest::detail::EqMatcher<int>_> local_2d0;
  undefined1 local_2a0 [8];
  AssertionResult iutest_ar_1;
  string local_258;
  AssertionHelper local_238;
  Fixed local_208;
  int local_6c;
  OptionalMatcher<int> local_68;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_Optional_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_6c = 1;
  iutest::matchers::Optional<int>(&local_68,&local_6c);
  iutest::detail::OptionalMatcher<int>::operator()((AssertionResult *)local_38,&local_68,&opt1);
  iutest::detail::OptionalMatcher<int>::~OptionalMatcher(&local_68);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    iutest::PrintToString<std::optional<int>>((string *)&iutest_ar_1.m_result,(iutest *)&opt1,v);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_258,pdVar2,"Optional(1)",local_38,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x355,&local_258,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_238,&local_208);
    iutest::AssertionHelper::~AssertionHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_2e4 = 1;
  EVar3 = iutest::matchers::Eq<int>((matchers *)&local_2e0,&local_2e4);
  iutest::matchers::Optional<iutest::detail::EqMatcher<int>>
            (&local_2d0,(matchers *)&local_2e0,(EqMatcher<int> *)EVar3.m_expected);
  iutest::detail::OptionalMatcher<iutest::detail::EqMatcher<int>>::operator()
            ((AssertionResult *)local_2a0,
             (OptionalMatcher<iutest::detail::EqMatcher<int>> *)&local_2d0,&opt1);
  iutest::detail::OptionalMatcher<iutest::detail::EqMatcher<int>_>::~OptionalMatcher(&local_2d0);
  iutest::detail::EqMatcher<int>::~EqMatcher(&local_2e0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    memset(&local_470,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_470);
    iutest::PrintToString<std::optional<int>>((string *)&iutest_ar_2.m_result,(iutest *)&opt1,v_00);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_4c0,pdVar2,"Optional(Eq(1))",local_2a0,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x356,&local_4c0,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_4a0,&local_470);
    iutest::AssertionHelper::~AssertionHelper(&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_470);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  iutest::detail::AlwaysZero();
  local_54c = 2;
  LVar4 = iutest::matchers::Lt<int>((matchers *)&local_548,&local_54c);
  iutest::matchers::Optional<iutest::detail::LtMatcher<int>>
            (&local_538,(matchers *)&local_548,(LtMatcher<int> *)LVar4.m_expected);
  iutest::detail::OptionalMatcher<iutest::detail::LtMatcher<int>>::operator()
            ((AssertionResult *)local_508,
             (OptionalMatcher<iutest::detail::LtMatcher<int>> *)&local_538,&opt1);
  iutest::detail::OptionalMatcher<iutest::detail::LtMatcher<int>_>::~OptionalMatcher(&local_538);
  iutest::detail::LtMatcher<int>::~LtMatcher(&local_548);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    memset(&local_6d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6d8);
    iutest::PrintToString<std::optional<int>>((string *)&iutest_ar_3.m_result,(iutest *)&opt1,v_01);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_728,pdVar2,"Optional(Lt(2))",local_508,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_708,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x357,&local_728,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_708,&local_6d8);
    iutest::AssertionHelper::~AssertionHelper(&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  iutest::detail::AlwaysZero();
  iutest::matchers::IsNull();
  iutest::matchers::Optional<iutest::detail::IsNullMatcher>(&local_7a0,&local_7a8);
  iutest::detail::OptionalMatcher<iutest::detail::IsNullMatcher>::operator()
            ((AssertionResult *)local_770,&local_7a0,&optnull);
  iutest::detail::OptionalMatcher<iutest::detail::IsNullMatcher>::~OptionalMatcher(&local_7a0);
  iutest::detail::IsNullMatcher::~IsNullMatcher(&local_7a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    memset(&local_930,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_930);
    iutest::PrintToString<std::optional<std::unique_ptr<int,std::default_delete<int>>>>
              (&local_9a0,(iutest *)&optnull,v_02);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_980,pdVar2,"Optional(IsNull())",local_770,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_960,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x359,&local_980,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_960,&local_930);
    iutest::AssertionHelper::~AssertionHelper(&local_960);
    std::__cxx11::string::~string((string *)&local_980);
    std::__cxx11::string::~string((string *)&local_9a0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_930);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  return;
}

Assistant:

IUTEST(Matcher, Optional)
{
    IUTEST_EXPECT_THAT(opt1, Optional(1));
    IUTEST_EXPECT_THAT(opt1, Optional(Eq(1)));
    IUTEST_EXPECT_THAT(opt1, Optional(Lt(2)));

    IUTEST_EXPECT_THAT(optnull, Optional(IsNull()));
}